

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
HashCallback<unsigned_int>::operator()(HashCallback<unsigned_int> *this,void *key,int len)

{
  size_type sVar1;
  reference pvVar2;
  undefined4 in_EDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint h;
  size_t newsize;
  value_type local_24;
  long local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     (in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_20 = sVar1 + 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  (*(code *)in_RDI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start)(in_RSI,in_EDX,0,&local_24);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back(in_RDI);
  *pvVar2 = local_24;
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);

    m_hashes.back() = h;
  }